

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_0::ArrayComparisonTest<const_int,_const_short>::ArrayComparisonTest
          (ArrayComparisonTest<const_int,_const_short> *this,initializer_list<const_int> left,
          initializer_list<const_short> right,TestOrdering expectedResult)

{
  int *piVar1;
  
  heapArray<int_const,int_const*>
            (&this->left,(kj *)left._M_array,(int *)((kj *)left._M_array + left._M_len * 4),
             (int *)right._M_array);
  piVar1 = (int *)_::HeapArrayDisposer::allocateImpl
                            (2,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  *piVar1 = *(int *)right._M_array;
  (this->right).ptr = (short *)piVar1;
  (this->right).size_ = 2;
  (this->right).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  this->expectedResult = (TestOrdering)right._M_len;
  return;
}

Assistant:

ArrayComparisonTest(std::initializer_list<A> left, std::initializer_list<B> right, TestOrdering expectedResult) :
    left(heapArray(left)), right(heapArray(right)), expectedResult(expectedResult) {}